

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O0

int xdtoi(int c)

{
  ushort **ppuVar1;
  int local_c;
  int c_local;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[c] & 0x800) == 0) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[c] & 0x200) == 0) {
      local_c = c + -0x37;
    }
    else {
      local_c = c + -0x57;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static inline int
xdtoi(c)
	register int c;
{
	if (isdigit(c))
		return c - '0';
	else if (islower(c))
		return c - 'a' + 10;
	else
		return c - 'A' + 10;
}